

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_rnglists.c
# Opt level: O0

int dwarf_load_rnglists(Dwarf_Debug dbg,Dwarf_Unsigned *rnglists_count,Dwarf_Error *error)

{
  int iVar1;
  Dwarf_Error local_40;
  Dwarf_Unsigned count;
  Dwarf_Rnglists_Context *cxt;
  Dwarf_Error *ppDStack_28;
  int res;
  Dwarf_Error *error_local;
  Dwarf_Unsigned *rnglists_count_local;
  Dwarf_Debug dbg_local;
  
  cxt._4_4_ = 1;
  count = 0;
  local_40 = (Dwarf_Error)0x0;
  ppDStack_28 = error;
  error_local = (Dwarf_Error *)rnglists_count;
  rnglists_count_local = &dbg->de_magic;
  if ((dbg == (Dwarf_Debug)0x0) || (dbg->de_magic != 0xebfdebfd)) {
    _dwarf_error_string((Dwarf_Debug)0x0,error,0x51,
                        "DW_DLE_DBG_NULL: dbg argument to dwarf_load_rnglistseither null or it containsa stale Dwarf_Debug pointer"
                       );
    dbg_local._4_4_ = 1;
  }
  else if (dbg->de_rnglists_context == (Dwarf_Rnglists_Context *)0x0) {
    if ((dbg->de_debug_rnglists).dss_size == 0) {
      dbg_local._4_4_ = -1;
    }
    else {
      if ((dbg->de_debug_rnglists).dss_data == (Dwarf_Small *)0x0) {
        iVar1 = _dwarf_load_section(dbg,&dbg->de_debug_rnglists,error);
        if (iVar1 != 0) {
          return iVar1;
        }
        cxt._4_4_ = 0;
      }
      iVar1 = internal_load_rnglists_contexts
                        ((Dwarf_Debug)rnglists_count_local,(Dwarf_Rnglists_Context **)&count,
                         (Dwarf_Unsigned *)&local_40,ppDStack_28);
      if (iVar1 == 1) {
        dbg_local._4_4_ = 1;
      }
      else {
        rnglists_count_local[0x2cb] = count;
        rnglists_count_local[0x2ca] = (Dwarf_Unsigned)local_40;
        if (error_local != (Dwarf_Error *)0x0) {
          *error_local = local_40;
        }
        dbg_local._4_4_ = 0;
      }
    }
  }
  else {
    if (rnglists_count != (Dwarf_Unsigned *)0x0) {
      *rnglists_count = dbg->de_rnglists_context_count;
    }
    dbg_local._4_4_ = 0;
  }
  return dbg_local._4_4_;
}

Assistant:

int dwarf_load_rnglists(
    Dwarf_Debug dbg,
    Dwarf_Unsigned *rnglists_count,
    Dwarf_Error *error)
{
    int res = DW_DLV_ERROR;
    Dwarf_Rnglists_Context *cxt = 0;
    Dwarf_Unsigned count = 0;

    CHECK_DBG(dbg,error,"dwarf_load_rnglists");
    if (dbg->de_rnglists_context) {
        if (rnglists_count) {
            *rnglists_count = dbg->de_rnglists_context_count;
        }
        return DW_DLV_OK;
    }
    if (!dbg->de_debug_rnglists.dss_size) {
        /* nothing there. */
        return DW_DLV_NO_ENTRY;
    }
    if (!dbg->de_debug_rnglists.dss_data) {
        res = _dwarf_load_section(dbg, &dbg->de_debug_rnglists,
            error);
        if (res != DW_DLV_OK) {
            return res;
        }
    }
    res = internal_load_rnglists_contexts(dbg,&cxt,&count,error);
    if (res == DW_DLV_ERROR) {
        return res;
    }
    dbg->de_rnglists_context = cxt;
    dbg->de_rnglists_context_count = count;
    if (rnglists_count) {
        *rnglists_count = count;
    }
    return DW_DLV_OK;
}